

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void do_undo_this_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *value;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object new_cmd;
  Am_Handler_Selective_Undo_Method method;
  Am_Object local_38;
  Am_Object undo_handler;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object command_to_undo;
  Am_Object *cmd_local;
  
  command_to_undo.data = (Am_Object_Data *)cmd;
  Am_Object::Am_Object(&local_20,cmd);
  get_command_to_undo(&local_18);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Am_Object((Am_Object *)&method.Call,cmd);
  get_undo_handler(&local_38);
  Am_Object::~Am_Object((Am_Object *)&method.Call);
  bVar1 = Am_Object::Valid(&local_18);
  if (bVar1) {
    Am_Handler_Selective_Undo_Method::Am_Handler_Selective_Undo_Method
              ((Am_Handler_Selective_Undo_Method *)&new_cmd);
    value = Am_Object::Get(&local_38,0x148,0);
    Am_Handler_Selective_Undo_Method::operator=((Am_Handler_Selective_Undo_Method *)&new_cmd,value);
    Am_Object::Am_Object(&local_60,&local_38);
    Am_Object::Am_Object(&local_68,&local_18);
    (*(code *)method.from_wrapper)(&local_58,&local_60,&local_68);
    Am_Object::~Am_Object(&local_68);
    Am_Object::~Am_Object(&local_60);
    Am_Object::~Am_Object(&local_58);
  }
  Am_Object::Am_Object(&local_70,cmd);
  mark_changed_command_to_undo(&local_70);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_undo_this, (Am_Object cmd))
{
  Am_Object command_to_undo = get_command_to_undo(cmd);
  Am_Object undo_handler = get_undo_handler(cmd);
  if (command_to_undo.Valid()) {
    Am_Handler_Selective_Undo_Method method;
    method = undo_handler.Get(Am_SELECTIVE_UNDO_METHOD);
    Am_Object new_cmd = method.Call(undo_handler, command_to_undo);
  }
  mark_changed_command_to_undo(cmd);
}